

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O0

t_int * sighip_perform(t_int *w)

{
  float fVar1;
  t_sample *ptVar2;
  t_int tVar3;
  int iVar4;
  float fVar5;
  t_sample new;
  t_sample normal;
  t_sample coef;
  t_sample last;
  int i;
  int n;
  t_hipctl *c;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  ptVar2 = (t_sample *)w[3];
  tVar3 = w[4];
  fVar1 = ptVar2[1];
  c = (t_hipctl *)w[2];
  out = (t_sample *)w[1];
  if (1.0 <= fVar1) {
    for (coef = 0.0; (int)coef < (int)tVar3; coef = (t_sample)((int)coef + 1)) {
      c->c_x = *out;
      c = (t_hipctl *)&c->c_coef;
      out = out + 1;
    }
    *ptVar2 = 0.0;
  }
  else {
    normal = *ptVar2;
    for (coef = 0.0; (int)coef < (int)tVar3; coef = (t_sample)((int)coef + 1)) {
      fVar5 = fVar1 * normal + *out;
      c->c_x = (fVar1 + 1.0) * 0.5 * (fVar5 - normal);
      normal = fVar5;
      c = (t_hipctl *)&c->c_coef;
      out = out + 1;
    }
    iVar4 = PD_BIGORSMALL(normal);
    if (iVar4 != 0) {
      normal = 0.0;
    }
    *ptVar2 = normal;
  }
  return w + 5;
}

Assistant:

static t_int *sighip_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    t_hipctl *c = (t_hipctl *)(w[3]);
    int n = (int)w[4];
    int i;
    t_sample last = c->c_x;
    t_sample coef = c->c_coef;
    if (coef < 1)
    {
        t_sample normal = 0.5*(1+coef);
        for (i = 0; i < n; i++)
        {
            t_sample new = *in++ + coef * last;
            *out++ = normal * (new - last);
            last = new;
        }
        if (PD_BIGORSMALL(last))
            last = 0;
        c->c_x = last;
    }
    else
    {
        for (i = 0; i < n; i++)
            *out++ = *in++;
        c->c_x = 0;
    }
    return (w+5);
}